

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

void __thiscall
llm_graph_input_out_ids::set_input(llm_graph_input_out_ids *this,llama_ubatch *ubatch)

{
  uint uVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  long in_RSI;
  long in_RDI;
  int i_1;
  int32_t n_outputs;
  int i;
  int32_t *data;
  int64_t n_tokens;
  int local_2c;
  int local_28;
  int local_24;
  
  if (((*(byte *)(*(long *)(in_RDI + 0x10) + 0x1904) & 1) != 0) ||
     (*(int *)(*(long *)(in_RDI + 0x18) + 0x40) == 0)) {
    if (*(long *)(in_RDI + 8) == 0) {
      llama_log_internal(GGML_LOG_LEVEL_WARN,"%s: \'out_ids\' is not created\n","set_input");
    }
    else {
      uVar1 = *(uint *)(in_RSI + 4);
      uVar4 = (ulong)uVar1;
      uVar3 = ggml_backend_buffer_is_host(*(undefined8 *)(*(long *)(in_RDI + 8) + 8));
      if ((uVar3 & 1) == 0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                   ,0x7f,"GGML_ASSERT(%s) failed","ggml_backend_buffer_is_host(out_ids->buffer)");
      }
      piVar2 = *(int **)(*(long *)(in_RDI + 8) + 0xf8);
      if ((long)*(int *)(in_RDI + 0x20) == uVar4) {
        for (local_24 = 0; (long)local_24 < (long)uVar4; local_24 = local_24 + 1) {
          piVar2[local_24] = local_24;
        }
      }
      else if (*(long *)(in_RSI + 0x38) == 0) {
        if (*(int *)(in_RDI + 0x20) == 1) {
          *piVar2 = uVar1 - 1;
        }
        else if (*(int *)(in_RDI + 0x20) != 0) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                     ,0x93,"GGML_ASSERT(%s) failed","n_outputs == 0");
        }
      }
      else {
        local_28 = 0;
        for (local_2c = 0; (long)local_2c < (long)uVar4; local_2c = local_2c + 1) {
          if (*(char *)(*(long *)(in_RSI + 0x38) + (long)local_2c) != '\0') {
            piVar2[local_28] = local_2c;
            local_28 = local_28 + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void llm_graph_input_out_ids::set_input(const llama_ubatch * ubatch) {
    if (hparams.causal_attn || cparams.pooling_type == LLAMA_POOLING_TYPE_NONE) {
        //GGML_ASSERT(out_ids && "every model that can must skip unused outputs");

        if (!out_ids) {
            LLAMA_LOG_WARN("%s: 'out_ids' is not created\n", __func__);
        } else {
            const int64_t n_tokens = ubatch->n_tokens;

            GGML_ASSERT(ggml_backend_buffer_is_host(out_ids->buffer));
            int32_t * data = (int32_t *) out_ids->data;

            if (n_outputs == n_tokens) {
                for (int i = 0; i < n_tokens; ++i) {
                    data[i] = i;
                }
            } else if (ubatch->output) {
                int32_t n_outputs = 0;
                for (int i = 0; i < n_tokens; ++i) {
                    if (ubatch->output[i]) {
                        data[n_outputs++] = i;
                    }
                }
                // the graph needs to have been passed the correct number of outputs
                GGML_ASSERT(n_outputs == n_outputs);
            } else if (n_outputs == 1) {
                // only keep last output
                data[0] = n_tokens - 1;
            } else {
                GGML_ASSERT(n_outputs == 0);
            }
        }
    }
}